

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int bhito(obj *obj,obj *otmp)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  boolean bVar4;
  obj *poVar5;
  monst *pmVar6;
  char *pcVar7;
  int iVar8;
  int oindx;
  
  if ((*(uint *)&obj->field_0x4a >> 0x1a & 1) != 0) {
    if (flags.bypasses != '\0') {
      return 0;
    }
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfbffffff;
  }
  if ((obj->where != '\x01') && (otmp->otyp != 0x1a4)) {
    warning("bhito: obj is not floor or Stone To Flesh spell");
  }
  if (uball == obj) {
    return 0;
  }
  sVar1 = otmp->otyp;
  if (uchain == obj) {
    if ((sVar1 != 0x1cc) && (sVar1 != 0x186)) {
      return 0;
    }
    unpunish();
    oindx = (int)otmp->otyp;
    iVar8 = 1;
    goto LAB_0029296f;
  }
  iVar8 = 0;
  switch(sVar1) {
  case 0x1c3:
  case 0x1c6:
  case 0x1c7:
    goto switchD_002926be_caseD_185;
  case 0x1c4:
switchD_002926be_caseD_187:
    if (obj->otyp == 0x215) {
      break_statue(obj);
    }
    else {
      if (obj->otyp != 0x214) {
        if (flags.mon_moving == '\0') {
          iVar8 = 0;
          hero_breaks(obj,obj->ox,obj->oy,'\0');
        }
        else {
          breaks(obj,obj->ox,obj->oy);
          iVar8 = 0;
        }
        goto LAB_0029296a;
      }
      fracture_rock(obj);
    }
    iVar8 = 1;
    goto LAB_0029296a;
  case 0x1c5:
    break;
  case 0x1c8:
switchD_00292751_caseD_19d:
    if (obj->otyp != 0x10f) {
      pmVar6 = revive(obj);
      return (uint)(pmVar6 != (monst *)0x0);
    }
    revive_egg(obj);
    break;
  case 0x1c9:
switchD_00292751_caseD_19e:
    uVar2 = obj->otyp;
    if (uVar2 < 0x19e) {
      if (uVar2 == 0xcf) {
        return 0;
      }
      if (uVar2 == 0x13a) {
        return 0;
      }
    }
    else {
      if (uVar2 == 0x19e) {
        return 0;
      }
      if (uVar2 == 0x1c9) {
        return 0;
      }
    }
    bVar4 = obj_resists(obj,5,0x5f);
    if (bVar4 != '\0') {
      return 0;
    }
    u.uconduct.polypiles = u.uconduct.polypiles + 1;
    if ((ushort)(obj->otyp - 0xdaU) < 3) {
      boxlock(obj,otmp);
    }
    bVar4 = obj_shudders(obj);
    if (bVar4 == '\0') {
      obj = poly_obj(obj,0);
      if ((obj->where == '\x01') && (obj->otyp == 0x214)) {
        block_point((int)obj->ox,(int)obj->oy);
      }
      goto LAB_002927cb;
    }
    if ((viz_array[obj->oy][obj->ox] & 2U) != 0) {
      discover_object((int)otmp->otyp,'\x01','\x01');
    }
    do_osshock(obj);
    break;
  case 0x1ca:
switchD_00292751_caseD_1a1:
    cancel_item(obj);
LAB_002927cb:
    newsym((int)obj->ox,(int)obj->oy);
    break;
  case 0x1cb:
switchD_00292751_caseD_19f:
    rloco(obj);
    break;
  case 0x1cc:
  case 0x1cd:
switchD_002926be_caseD_186:
    if (2 < (ushort)(obj->otyp - 0xdaU)) {
      return 0;
    }
    bVar4 = boxlock(obj,otmp);
    if (bVar4 == '\0') {
      return 0;
    }
    iVar8 = (int)bVar4;
LAB_0029296a:
    oindx = (int)otmp->otyp;
LAB_0029296f:
    discover_object(oindx,'\x01','\x01');
    return iVar8;
  case 0x1ce:
    uVar3 = *(uint *)&obj->field_0x4a;
    *(uint *)&obj->field_0x4a = uVar3 | 0x20;
    if (((ushort)obj->otyp - 0xda < 8) || (obj->otyp == 0x215)) {
      poVar5 = obj->cobj;
      if (poVar5 == (obj *)0x0) {
        pcVar7 = Tobjnam(obj,"are");
        pline("%s empty.",pcVar7);
      }
      else {
        do {
          poVar5->field_0x4a = poVar5->field_0x4a | 0x20;
          poVar5 = poVar5->nobj;
        } while (poVar5 != (obj *)0x0);
        display_cinventory(obj);
      }
    }
    else if ((uVar3 & 0x20) != 0) {
      return 0;
    }
    iVar8 = 1;
    oindx = 0x1ce;
    goto LAB_0029296f;
  default:
    iVar8 = 0;
    switch(sVar1) {
    case 0x185:
    case 0x18b:
      goto switchD_002926be_caseD_185;
    case 0x186:
    case 0x18c:
      goto switchD_002926be_caseD_186;
    case 0x187:
      goto switchD_002926be_caseD_187;
    case 0x18a:
      drain_item(obj);
      break;
    default:
      iVar8 = 0;
      switch(sVar1) {
      case 0x196:
        goto switchD_002926be_caseD_185;
      case 0x19d:
        goto switchD_00292751_caseD_19d;
      case 0x19e:
        goto switchD_00292751_caseD_19e;
      case 0x19f:
        goto switchD_00292751_caseD_19f;
      case 0x1a1:
        goto switchD_00292751_caseD_1a1;
      case 0x1a4:
        iVar8 = hito_stone_to_flesh(obj);
        return iVar8;
      }
    case 0x188:
    case 0x189:
      warning("What an interesting effect (%d)");
    }
  }
  iVar8 = 1;
switchD_002926be_caseD_185:
  return iVar8;
}

Assistant:

int bhito(struct obj *obj, struct obj *otmp)
{
	int res = 1;	/* affected object by default */

	if (obj->bypass) {
		/* The bypass bit is currently only used as follows:
		 *
		 * POLYMORPH - When a monster being polymorphed drops something
		 *             from its inventory as a result of the change.
		 *             If the items fall to the floor, they are not
		 *             subject to direct subsequent polymorphing
		 *             themselves on that same zap. This makes it
		 *             consistent with items that remain in the
		 *             monster's inventory. They are not polymorphed
		 *             either.
		 * UNDEAD_TURNING - When an undead creature gets killed via
		 *	       undead turning, prevent its corpse from being
		 *	       immediately revived by the same effect.
		 *
		 * The bypass bit on all objects is reset each turn, whenever
		 * flags.bypasses is set.
		 *
		 * We check the obj->bypass bit above AND flags.bypasses
		 * as a safeguard against any stray occurrence left in an obj
		 * struct someplace, although that should never happen.
		 */
		if (flags.bypasses)
			return 0;
		else
			obj->bypass = 0;
	}

	/*
	 * Some parts of this function expect the object to be on the floor
	 * obj->{ox,oy} to be valid.  The exception to this (so far) is
	 * for the STONE_TO_FLESH spell.
	 */
	if (!(obj->where == OBJ_FLOOR || otmp->otyp == SPE_STONE_TO_FLESH))
	    warning("bhito: obj is not floor or Stone To Flesh spell");

	if (obj == uball) {
		res = 0;
	} else if (obj == uchain) {
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK) {
		    unpunish();
		    makeknown(otmp->otyp);
		} else
		    res = 0;
	} else
	switch(otmp->otyp) {
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
		if (obj->otyp == WAN_POLYMORPH ||
			obj->otyp == SPE_POLYMORPH ||
			obj->otyp == POT_POLYMORPH ||
			obj->otyp == AMULET_OF_UNCHANGING ||
			obj_resists(obj, 5, 95)) {
		    res = 0;
		    break;
		}
		/* KMH, conduct */
		u.uconduct.polypiles++;
		/* any saved lock context will be dangerously obsolete */
		if (Is_box(obj)) boxlock(obj, otmp);

		if (obj_shudders(obj)) {
		    if (cansee(obj->ox, obj->oy))
			makeknown(otmp->otyp);
		    do_osshock(obj);
		    break;
		}
		obj = poly_obj(obj, STRANGE_OBJECT);
		/* poly_obj doesn't block vision, do that ourselves now. */
		if (obj->where == OBJ_FLOOR && obj->otyp == BOULDER)
		    block_point(obj->ox, obj->oy);
		newsym(obj->ox,obj->oy);
		break;
	case WAN_PROBING:
		res = !obj->dknown;
		/* target object has now been "seen (up close)" */
		obj->dknown = 1;
		if (Is_container(obj) || obj->otyp == STATUE) {
		    if (!obj->cobj)
			pline("%s empty.", Tobjnam(obj, "are"));
		    else {
			struct obj *o;
			/* view contents (not recursively) */
			for (o = obj->cobj; o; o = o->nobj)
			    o->dknown = 1;	/* "seen", even if blind */
			display_cinventory(obj);
		    }
		    res = 1;
		}
		if (res) makeknown(WAN_PROBING);
		break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
		if (obj->otyp == BOULDER)
			fracture_rock(obj);
		else if (obj->otyp == STATUE)
			break_statue(obj);
		else {
			if (!flags.mon_moving)
			    hero_breaks(obj, obj->ox, obj->oy, FALSE);
			else
			    breaks(obj, obj->ox, obj->oy);
			res = 0;
		}
		/* BUG[?]: shouldn't this depend upon you seeing it happen? */
		makeknown(otmp->otyp);
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_item(obj);
		newsym(obj->ox,obj->oy);	/* might change color */
		break;
	case SPE_DRAIN_LIFE:
		drain_item(obj);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		rloco(obj);
		break;
	case WAN_MAKE_INVISIBLE:
#ifdef INVISIBLE_OBJECTS
		obj->oinvis = TRUE;
		newsym(obj->ox,obj->oy);	/* make object disappear */
#endif
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		if (obj->otyp == EGG)
			revive_egg(obj);
		else
			res = !!revive(obj);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		if (Is_box(obj))
			res = boxlock(obj, otmp);
		else
			res = 0;
		if (res /* && otmp->oclass == WAND_CLASS */)
			makeknown(otmp->otyp);
		break;
	case WAN_SLOW_MONSTER:		/* no effect on objects */
	case SPE_SLOW_MONSTER:
	case WAN_SPEED_MONSTER:
	case WAN_NOTHING:
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		res = 0;
		break;
	case SPE_STONE_TO_FLESH:
		res = hito_stone_to_flesh(obj);
		break;
	default:
		warning("What an interesting effect (%d)", otmp->otyp);
		break;
	}
	return res;
}